

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

Result __thiscall
testing::internal::
FunctionMocker<const_std::map<ot::commissioner::Address,_ot::commissioner::EnergyReport,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>_&()>
::PerformDefaultAction
          (FunctionMocker<const_std::map<ot::commissioner::Address,_ot::commissioner::EnergyReport,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>_&()>
           *this,ArgumentTuple *args,string *call_description)

{
  OnCallSpec<const_std::map<ot::commissioner::Address,_ot::commissioner::EnergyReport,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>_&()>
  *this_00;
  long *plVar1;
  pointer pcVar2;
  Result pmVar3;
  char cVar4;
  Action<const_std::map<ot::commissioner::Address,_ot::commissioner::EnergyReport,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>_&()>
  *pAVar5;
  Result pmVar6;
  runtime_error *this_01;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  __tmp;
  pointer ppvVar7;
  string message;
  undefined **local_58;
  undefined8 local_50;
  undefined *local_48 [2];
  string *local_38;
  
  ppvVar7 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_38 = call_description;
  while (ppvVar7 !=
         (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
         super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
         super__Vector_impl_data._M_start) {
    this_00 = (OnCallSpec<const_std::map<ot::commissioner::Address,_ot::commissioner::EnergyReport,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>_&()>
               *)ppvVar7[-1];
    ppvVar7 = ppvVar7 + -1;
    local_50 = 0;
    local_58 = &PTR__MatchResultListener_002da950;
    plVar1 = *(long **)(this_00 + 0x20);
    cVar4 = (**(code **)(*plVar1 + 0x20))(plVar1,args,&local_58);
    if (cVar4 != '\0') {
      pAVar5 = OnCallSpec<const_std::map<ot::commissioner::Address,_ot::commissioner::EnergyReport,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>_&()>
               ::GetAction(this_00);
      pmVar6 = Action<const_std::map<ot::commissioner::Address,_ot::commissioner::EnergyReport,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>_&()>
               ::Perform(pAVar5);
      return pmVar6;
    }
  }
  pcVar2 = (local_38->_M_dataplus)._M_p;
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + local_38->_M_string_length);
  std::__cxx11::string::append((char *)&local_58);
  pmVar3 = DefaultValue<std::map<ot::commissioner::Address,ot::commissioner::EnergyReport,std::less<ot::commissioner::Address>,std::allocator<std::pair<ot::commissioner::Address_const,ot::commissioner::EnergyReport>>>const&>
           ::address_;
  if (DefaultValue<std::map<ot::commissioner::Address,ot::commissioner::EnergyReport,std::less<ot::commissioner::Address>,std::allocator<std::pair<ot::commissioner::Address_const,ot::commissioner::EnergyReport>>>const&>
      ::address_ == (Result)0x0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,(string *)&local_58);
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_58 == local_48) {
    return DefaultValue<std::map<ot::commissioner::Address,ot::commissioner::EnergyReport,std::less<ot::commissioner::Address>,std::allocator<std::pair<ot::commissioner::Address_const,ot::commissioner::EnergyReport>>>const&>
           ::address_;
  }
  operator_delete(local_58);
  return pmVar3;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }